

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O1

int SZ_BufftoBuffCompress(void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int i;
  uint uVar4;
  uint uVar5;
  void *__ptr;
  uchar *__ptr_00;
  sbyte sVar6;
  sbyte sVar7;
  int iVar8;
  ulong uVar9;
  uint *__src;
  ulong uVar10;
  size_t __size;
  size_t sVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong __n_00;
  aec_stream strm;
  char zero_pixel [4];
  uchar *local_2d8;
  aec_stream local_280;
  uint local_238 [16];
  undefined4 local_1f8;
  undefined4 local_1b8;
  
  uVar1 = param->pixels_per_block;
  iVar15 = param->pixels_per_scanline;
  uVar4 = (int)(iVar15 + uVar1 + -1) / (int)uVar1;
  uVar2 = param->options_mask;
  uVar13 = 0;
  local_280.block_size = uVar1;
  local_280.rsi = uVar4;
  memset(local_238,0,0x204);
  local_1f8 = 4;
  local_1b8 = 8;
  uVar5 = 1;
  do {
    if ((uVar5 & uVar2) != 0) {
      uVar13 = uVar13 | local_238[(int)uVar5];
    }
    uVar5 = uVar5 * 2;
  } while ((int)uVar5 < 0x81);
  local_280.flags = uVar13 | 0x40;
  local_280.avail_out = *destLen;
  uVar2 = param->bits_per_pixel;
  local_280.next_out = (uchar *)dest;
  if ((uVar2 == 0x40) || (__ptr = source, local_280.bits_per_sample = uVar2, uVar2 == 0x20)) {
    local_280.bits_per_sample = 8;
    __ptr = malloc(sourceLen);
    if (__ptr == (void *)0x0) {
      iVar15 = -4;
      __ptr_00 = (uchar *)0x0;
      __ptr = (void *)0x0;
      goto LAB_00129623;
    }
    uVar5 = uVar2 + 7;
    if (-1 < (int)uVar2) {
      uVar5 = uVar2;
    }
    uVar9 = (ulong)((int)uVar5 >> 3);
    if (uVar9 <= sourceLen) {
      uVar10 = 0;
      do {
        lVar12 = 0;
        do {
          *(undefined1 *)((long)__ptr + lVar12 * (sourceLen / uVar9) + uVar10) =
               *(undefined1 *)((long)source + lVar12);
          lVar12 = lVar12 + 1;
        } while (uVar9 + (uVar9 == 0) != lVar12);
        uVar10 = uVar10 + 1;
        source = (void *)((long)source + uVar9);
      } while (uVar10 < sourceLen / uVar9);
    }
  }
  uVar5 = local_280.bits_per_sample;
  sVar6 = 8 < (int)local_280.bits_per_sample;
  __n = (ulong)(byte)sVar6 + 1;
  if (0x10 < (int)local_280.bits_per_sample) {
    sVar6 = 2;
    __n = 4;
  }
  iVar8 = uVar4 * uVar1;
  __size = (ulong)(uint)(iVar8 << sVar6) *
           ((((sourceLen >> sVar6) + (long)iVar15) - 1) / (ulong)(long)iVar15);
  __ptr_00 = (uchar *)malloc(__size);
  if (__ptr_00 == (uchar *)0x0) {
    iVar15 = -4;
    __ptr_00 = (uchar *)0x0;
  }
  else {
    sVar6 = 8 < (int)uVar5;
    if (0x10 < (int)uVar5) {
      sVar6 = 2;
    }
    local_238[0] = 0;
    __src = local_238;
    if (sourceLen != 0) {
      sVar7 = 2;
      if ((int)uVar5 < 0x11) {
        sVar7 = 8 < (int)uVar5;
      }
      uVar9 = (ulong)(iVar15 << sVar6);
      sVar11 = (uint)(iVar8 - iVar15 << sVar7) + uVar9;
      lVar12 = 0;
      uVar10 = 0;
      local_2d8 = __ptr_00;
      do {
        __n_00 = sourceLen - uVar10;
        if (uVar9 <= sourceLen - uVar10) {
          __n_00 = uVar9;
        }
        memcpy(__ptr_00 + lVar12,(void *)((long)__ptr + uVar10),__n_00);
        uVar10 = uVar10 + __n_00;
        puVar3 = (uint *)((long)__ptr + (uVar10 - __n));
        if ((uVar13 & 8) == 0) {
          puVar3 = __src;
        }
        __src = puVar3;
        if (sVar11 != __n_00) {
          uVar14 = 0;
          do {
            memcpy(local_2d8 + uVar14 + __n_00,__src,__n);
            uVar14 = uVar14 + __n;
          } while (uVar14 < sVar11 - __n_00);
        }
        lVar12 = lVar12 + sVar11;
        local_2d8 = local_2d8 + sVar11;
      } while (uVar10 < sourceLen);
    }
    local_280.next_in = __ptr_00;
    local_280.avail_in = __size;
    iVar8 = aec_buffer_encode(&local_280);
    iVar15 = 2;
    if (iVar8 != -2) {
      iVar15 = iVar8;
    }
    *destLen = local_280.total_out;
  }
LAB_00129623:
  if (__ptr_00 != (uchar *)0x0) {
    free(__ptr_00);
  }
  if ((uVar2 == 0x20 || uVar2 == 0x40) && __ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar15;
}

Assistant:

int SZ_BufftoBuffCompress(void *dest, size_t *destLen,
                          const void *source, size_t sourceLen,
                          SZ_com_t *param)
{
    struct aec_stream strm;
    int status;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = AEC_NOT_ENFORCE | convert_options(param->options_mask);
    strm.avail_out = *destLen;
    strm.next_out = dest;
    void *buf = 0;
    void *padbuf = 0;

    int interleave = param->bits_per_pixel == 32 || param->bits_per_pixel == 64;
    if (interleave) {
        strm.bits_per_sample = 8;
        buf = malloc(sourceLen);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        interleave_buffer(buf, source, sourceLen, param->bits_per_pixel / 8);
    } else {
        strm.bits_per_sample = param->bits_per_pixel;
        buf = (void *)source;
    }

    int pixel_size = bits_to_bytes(strm.bits_per_sample);

    size_t scanlines = (sourceLen / pixel_size + param->pixels_per_scanline - 1)
        / param->pixels_per_scanline;
    size_t padbuf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
    padbuf = malloc(padbuf_size);
    if (padbuf == NULL) {
        status = SZ_MEM_ERROR;
        goto CLEANUP;
    }

    size_t padding_size =
        (strm.rsi * strm.block_size - param->pixels_per_scanline)
        * pixel_size;

    add_padding(padbuf, buf, sourceLen,
                param->pixels_per_scanline * pixel_size,
                padding_size, pixel_size,
                strm.flags & AEC_DATA_PREPROCESS);
    strm.next_in = padbuf;
    strm.avail_in = padbuf_size;

    int aec_status = aec_buffer_encode(&strm);
    if (aec_status == AEC_STREAM_ERROR)
        status = SZ_OUTBUFF_FULL;
    else
        status = aec_status;
    *destLen = strm.total_out;

CLEANUP:
    if (padbuf)
        free(padbuf);
    if (interleave && buf)
        free(buf);
    return status;
}